

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O2

int __thiscall zmq::tcp_address_t::resolve(tcp_address_t *this,char *name_,bool param_2,bool ipv6_)

{
  int iVar1;
  char *pcVar2;
  ip_resolver_options_t *piVar3;
  ip_resolver_options_t src_resolver_opts;
  ip_resolver_options_t resolver_opts;
  ip_resolver_t resolver;
  _func_int *local_40 [2];
  
  pcVar2 = strrchr(name_,0x3b);
  if (pcVar2 != (char *)0x0) {
    resolver._vptr_ip_resolver_t = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&resolver,name_,pcVar2);
    ip_resolver_options_t::ip_resolver_options_t(&src_resolver_opts);
    piVar3 = ip_resolver_options_t::bindable(&src_resolver_opts,true);
    piVar3 = ip_resolver_options_t::allow_dns(piVar3,false);
    piVar3 = ip_resolver_options_t::allow_nic_name(piVar3,true);
    piVar3 = ip_resolver_options_t::ipv6(piVar3,ipv6_);
    ip_resolver_options_t::expect_port(piVar3,true);
    ip_resolver_t::ip_resolver_t
              ((ip_resolver_t *)&resolver_opts,
               (ip_resolver_options_t)
               ((uint6)stack0xffffffffffffff9c << 0x20 | (uint6)(uint)src_resolver_opts._0_4_));
    iVar1 = ip_resolver_t::resolve
                      ((ip_resolver_t *)&resolver_opts,&this->_source_address,
                       (char *)resolver._vptr_ip_resolver_t);
    if (iVar1 == 0) {
      name_ = pcVar2 + 1;
      this->_has_src_addr = true;
    }
    std::__cxx11::string::~string((string *)&resolver);
    if (iVar1 != 0) {
      return -1;
    }
  }
  ip_resolver_options_t::ip_resolver_options_t(&resolver_opts);
  piVar3 = ip_resolver_options_t::bindable(&resolver_opts,param_2);
  piVar3 = ip_resolver_options_t::allow_dns(piVar3,!param_2);
  piVar3 = ip_resolver_options_t::allow_nic_name(piVar3,param_2);
  piVar3 = ip_resolver_options_t::ipv6(piVar3,ipv6_);
  ip_resolver_options_t::expect_port(piVar3,true);
  ip_resolver_t::ip_resolver_t
            (&resolver,
             (ip_resolver_options_t)
             ((uint6)stack0xffffffffffffffa4 << 0x20 | (uint6)(uint)resolver_opts._0_4_));
  iVar1 = ip_resolver_t::resolve(&resolver,&this->_address,name_);
  return iVar1;
}

Assistant:

int zmq::tcp_address_t::resolve (const char *name_, bool local_, bool ipv6_)
{
    // Test the ';' to know if we have a source address in name_
    const char *src_delimiter = strrchr (name_, ';');
    if (src_delimiter) {
        const std::string src_name (name_, src_delimiter - name_);

        ip_resolver_options_t src_resolver_opts;

        src_resolver_opts
          .bindable (true)
          //  Restrict hostname/service to literals to avoid any DNS
          //  lookups or service-name irregularity due to
          //  indeterminate socktype.
          .allow_dns (false)
          .allow_nic_name (true)
          .ipv6 (ipv6_)
          .expect_port (true);

        ip_resolver_t src_resolver (src_resolver_opts);

        const int rc =
          src_resolver.resolve (&_source_address, src_name.c_str ());
        if (rc != 0)
            return -1;
        name_ = src_delimiter + 1;
        _has_src_addr = true;
    }

    ip_resolver_options_t resolver_opts;

    resolver_opts.bindable (local_)
      .allow_dns (!local_)
      .allow_nic_name (local_)
      .ipv6 (ipv6_)
      .expect_port (true);

    ip_resolver_t resolver (resolver_opts);

    return resolver.resolve (&_address, name_);
}